

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCodeMetadataExpr
          (ExprVisitorDelegate *this,CodeMetadataExpr *expr)

{
  WatWriter *pWVar1;
  const_pointer src;
  size_type sVar2;
  uchar *data;
  CodeMetadataExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  WriteOpen(this->writer_,"@metadata.code.",None);
  pWVar1 = this->writer_;
  src = std::basic_string_view<char,_std::char_traits<char>_>::data(&expr->name);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&expr->name);
  WriteDataWithNextChar(pWVar1,src,sVar2);
  WritePutc(this->writer_,' ');
  pWVar1 = this->writer_;
  data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&expr->data);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&expr->data);
  WriteQuotedData(pWVar1,data,sVar2);
  WriteCloseSpace(this->writer_);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCodeMetadataExpr(
    CodeMetadataExpr* expr) {
  writer_->WriteOpen("@metadata.code.", NextChar::None);
  writer_->WriteDataWithNextChar(expr->name.data(), expr->name.size());
  writer_->WritePutc(' ');
  writer_->WriteQuotedData(expr->data.data(), expr->data.size());
  writer_->WriteCloseSpace();
  return Result::Ok;
}